

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

int __thiscall cppcms::json::anon_unknown_9::tockenizer::next(tockenizer *this)

{
  byte bVar1;
  tockenizer *this_00;
  byte *pbVar2;
  pointer pcVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint i;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  uint unaff_R13D;
  uint uVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  char buf [5];
  uint v;
  uint local_4c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ushort local_3c [2];
  istream *local_38;
  
  this_00 = *(tockenizer **)(this->is_ + *(long *)(*(long *)this->is_ + -0x18) + 0xe8);
LAB_0010b065:
  pbVar2 = *(byte **)(this_00 + 0x10);
  if (pbVar2 < *(byte **)(this_00 + 0x18)) {
    uVar13 = (uint)*pbVar2;
    *(byte **)(this_00 + 0x10) = pbVar2 + 1;
  }
  else {
    uVar13 = (**(code **)(*(long *)this_00 + 0x50))(this_00);
  }
  if (0x5a < (int)uVar13) {
    if ((int)uVar13 < 0x6e) {
      if ((uVar13 != 0x5b) && (uVar13 != 0x5d)) {
        if (uVar13 != 0x66) goto switchD_0010b0a5_caseD_21;
        bVar7 = check(this,"alse");
        uVar13 = (uint)bVar7 * 4 + 0x100;
      }
    }
    else if ((int)uVar13 < 0x7b) {
      if (uVar13 == 0x6e) {
        bVar7 = check(this,"ull");
        uVar13 = (uint)bVar7 + (uint)bVar7 * 4 + 0x100;
      }
      else {
        if (uVar13 != 0x74) goto switchD_0010b0a5_caseD_21;
        bVar7 = check(this,"rue");
        uVar13 = (uint)bVar7 + (uint)bVar7 * 2 + 0x100;
      }
    }
    else if ((uVar13 != 0x7d) && (uVar13 != 0x7b)) goto switchD_0010b0a5_caseD_21;
    goto switchD_0010b0a5_caseD_2c;
  }
  if ((int)uVar13 < 0xd) {
    if (uVar13 != 0xffffffff) {
      if (uVar13 != 9) {
        if (uVar13 != 10) goto switchD_0010b0a5_caseD_21;
        this->line = this->line + 1;
      }
      goto switchD_0010b0a5_caseD_20;
    }
LAB_0010b4ba:
    bVar7 = false;
    uVar13 = 0xff;
    goto LAB_0010b0e7;
  }
  switch(uVar13) {
  case 0x20:
    break;
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    goto switchD_0010b0a5_caseD_21;
  case 0x22:
    if (*(ulong *)(this_00 + 8) < *(ulong *)(this_00 + 0x10)) {
      *(ulong *)(this_00 + 0x10) = *(ulong *)(this_00 + 0x10) - 1;
    }
    else {
      _GLOBAL__N_1::tockenizer::next(this_00);
    }
    pcVar3 = (this->str)._M_dataplus._M_p;
    plVar4 = *(long **)(this->is_ + *(long *)(*(long *)this->is_ + -0x18) + 0xe8);
    (this->str)._M_string_length = 0;
    *pcVar3 = '\0';
    pbVar2 = (byte *)plVar4[2];
    if (pbVar2 < (byte *)plVar4[3]) {
      uVar10 = (uint)*pbVar2;
      plVar4[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar10 = (**(code **)(*plVar4 + 0x50))(plVar4);
    }
    uVar13 = 0x100;
    if (uVar10 == 0x22) {
      local_4c = 0x22;
      bVar7 = false;
      uVar10 = 0;
LAB_0010b248:
      pbVar2 = (byte *)plVar4[2];
      if (pbVar2 < (byte *)plVar4[3]) {
        uVar8 = (uint)*pbVar2;
        plVar4[2] = (long)(pbVar2 + 1);
      }
      else {
        uVar8 = (**(code **)(*plVar4 + 0x50))(plVar4);
      }
      if (((uVar8 == 0xffffffff) || (uVar8 < 0x20)) || ((bool)(uVar8 != 0x5c & bVar7)))
      goto switchD_0010b2e1_caseD_6f;
      if (uVar8 != 0x5c) {
        if (uVar8 != 0x22) goto LAB_0010b2fc;
        local_48._M_current = (this->str)._M_dataplus._M_p;
        e._M_current = local_48._M_current + (this->str)._M_string_length;
        goto LAB_0010b4e5;
      }
      pbVar2 = (byte *)plVar4[2];
      if (pbVar2 < (byte *)plVar4[3]) {
        uVar8 = (uint)*pbVar2;
        plVar4[2] = (long)(pbVar2 + 1);
      }
      else {
        uVar8 = (**(code **)(*plVar4 + 0x50))(plVar4);
      }
      if ((uVar8 == 0xffffffff) || ((bool)(uVar8 != 0x75 & bVar7))) goto switchD_0010b2e1_caseD_6f;
      if ((int)uVar8 < 0x62) {
        if (((uVar8 == 0x22) || (uVar8 == 0x2f)) || (uVar8 == 0x5c)) goto LAB_0010b2fc;
        goto switchD_0010b2e1_caseD_6f;
      }
      switch(uVar8) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_0010b2e1_caseD_6f;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        local_48._M_current = local_48._M_current & 0xffffff0000000000;
        local_38 = this->is_;
        std::ios::widen((char)*(undefined8 *)(*(long *)local_38 + -0x18) + (char)local_38);
        plVar11 = (long *)std::istream::get((char *)local_38,(long)&local_48,'\x05');
        if ((*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5) == 0) {
          lVar12 = 0;
          do {
            bVar1 = *(byte *)((long)&local_48._M_current + lVar12);
            if ((9 < (byte)(bVar1 - 0x30)) &&
               ((uVar8 = bVar1 - 0x41, 0x25 < uVar8 ||
                ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) {
              bVar5 = false;
              goto LAB_0010b3fc;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          __isoc99_sscanf(&local_48,"%x",local_3c);
          local_4c = (uint)local_3c[0];
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
LAB_0010b3fc:
        if (bVar5) {
          if (bVar7) {
            if ((local_4c & 0xfc00) != 0xdc00) goto LAB_0010b43c;
            bVar7 = false;
            uVar9 = (uVar10 & 0x3ff) * 0x400 + (local_4c & 0x3ff) + 0x10000;
          }
          else {
            bVar5 = true;
            uVar8 = local_4c;
            uVar9 = local_4c;
            bVar6 = true;
            if ((local_4c & 0xfc00) == 0xd800) goto LAB_0010b464;
          }
          append(this,uVar9);
          bVar5 = true;
          uVar8 = uVar10;
          bVar6 = bVar7;
        }
        else {
LAB_0010b43c:
          bVar5 = false;
          uVar8 = uVar10;
          bVar6 = bVar7;
        }
LAB_0010b464:
        bVar7 = bVar6;
        uVar10 = uVar8;
        if (!bVar5) goto switchD_0010b2e1_caseD_6f;
        goto LAB_0010b248;
      default:
        if ((uVar8 != 0x62) && (uVar8 != 0x66)) goto switchD_0010b2e1_caseD_6f;
      }
LAB_0010b2fc:
      std::__cxx11::string::push_back((char)this);
      goto LAB_0010b248;
    }
  case 0x2c:
  case 0x3a:
    goto switchD_0010b0a5_caseD_2c;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    if (*(ulong *)(this_00 + 8) < *(ulong *)(this_00 + 0x10)) {
      *(ulong *)(this_00 + 0x10) = *(ulong *)(this_00 + 0x10) - 1;
    }
    else {
      _GLOBAL__N_1::tockenizer::next(this_00);
    }
    std::istream::_M_extract<double>((double *)this->is_);
    uVar13 = (uint)(((byte)this->is_[*(long *)(*(long *)this->is_ + -0x18) + 0x20] & 5) == 0) * 2 +
             0x100;
    goto switchD_0010b0a5_caseD_2c;
  case 0x2f:
    bVar7 = check(this,"/");
    if (!bVar7) goto switchD_0010b0a5_caseD_21;
    do {
      pbVar2 = *(byte **)(this_00 + 0x10);
      if (pbVar2 < *(byte **)(this_00 + 0x18)) {
        uVar13 = (uint)*pbVar2;
        *(byte **)(this_00 + 0x10) = pbVar2 + 1;
      }
      else {
        uVar13 = (**(code **)(*(long *)this_00 + 0x50))(this_00);
      }
      if (uVar13 == 0xffffffff) goto LAB_0010b4ba;
    } while (uVar13 != 10);
    break;
  default:
    if (uVar13 != 0xd) goto switchD_0010b0a5_caseD_21;
  }
switchD_0010b0a5_caseD_20:
  bVar7 = true;
  uVar13 = unaff_R13D;
  goto LAB_0010b0e7;
switchD_0010b2e1_caseD_6f:
  bVar7 = false;
  goto LAB_0010b0e7;
  while (uVar9 = utf8::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (&local_48,e,false,false), uVar9 != 0xffffffff) {
LAB_0010b4e5:
    if (local_48._M_current == e._M_current) {
      uVar13 = 0x101;
      goto switchD_0010b0a5_caseD_2c;
    }
  }
switchD_0010b0a5_caseD_21:
  uVar13 = 0x100;
switchD_0010b0a5_caseD_2c:
  bVar7 = false;
LAB_0010b0e7:
  unaff_R13D = uVar13;
  if (!bVar7) {
    return uVar13;
  }
  goto LAB_0010b065;
}

Assistant:

int next()
			{
				std::streambuf *buf = is_.rdbuf();
				for(;;) {
					int c;
					if((c=buf->sbumpc())==-1)
						return tock_eof;
					switch(c) {
					case '[':
					case '{':
					case ':':
					case ',':
					case '}':
					case ']':
						return c;
					case ' ':
					case '\t':
					case '\r':
						break;
					case '\n':
						line++;
						break;
					case '"':
						buf->sungetc();
						if(parse_string())
							return tock_str;
						return tock_err;
					case 't':
						if(check("rue"))
							return tock_true;
						return tock_err;
					case 'n':
						if(check("ull"))
							return tock_null;
						return tock_err;
					case 'f':
						if(check("alse"))
							return tock_false;
						return tock_err;
					case '-':
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
					case '8':
					case '9':
						buf->sungetc();
						if(parse_number())
							return tock_number;
						return tock_err;
					case '/':
						if(check("/")) {
							while((c=buf->sbumpc())!=-1 && c!='\n')
								;
							if(c=='\n')
								break;
							return tock_eof;
						}
						return tock_err;
					default:
						return tock_err;
					}
				}
			}